

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O0

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *this,string *name,cmake *cm)

{
  bool bVar1;
  cmGlobalNinjaGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  cmake *local_28;
  cmake *cm_local;
  string *name_local;
  cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *this_local;
  
  local_28 = cm;
  cm_local = (cmake *)name;
  name_local = (string *)this;
  cmGlobalNinjaGenerator::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=(name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    this_local = (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *)0x0;
  }
  else {
    this_00 = (cmGlobalNinjaGenerator *)operator_new(0x788);
    cmGlobalNinjaGenerator::cmGlobalNinjaGenerator(this_00,local_28);
    this_local = (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaGenerator> *)this_00;
  }
  return (cmGlobalGenerator *)this_local;
}

Assistant:

virtual cmGlobalGenerator*
  CreateGlobalGenerator(const std::string& name, cmake* cm) const {
    if (name != T::GetActualName()) return 0;
    return new T(cm); }